

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O2

void __thiscall Projector::LoadSlice(Projector *this,string *imageLoc,ofstream *myFile)

{
  ostream *poVar1;
  char *pcVar2;
  thread t_display;
  Projector *local_88;
  code *local_80;
  undefined8 local_78;
  
  std::__cxx11::string::_M_assign((string *)&this->CurrentImageLoc);
  cv::imread((string *)&local_80,(int)imageLoc);
  cv::Mat::operator=(&this->CurrentImage,(Mat *)&local_80);
  cv::Mat::~Mat((Mat *)&local_80);
  local_80 = DisplayCurrentSlice;
  local_78 = 0;
  local_88 = this;
  std::thread::thread<void(Projector::*)(),Projector*,void>(&t_display,(type *)&local_80,&local_88);
  std::thread::detach();
  if (*(long *)&this->field_0x38 == 0) {
    pcVar2 = "No Image data!";
    poVar1 = std::operator<<((ostream *)&std::cout,"No Image data!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    pcVar2 = "New Image loaded";
    poVar1 = std::operator<<((ostream *)&std::cout,"New Image loaded");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)myFile,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::thread::~thread(&t_display);
  return;
}

Assistant:

void Projector::LoadSlice(string imageLoc, ofstream &myFile)
{

	CurrentImageLoc = imageLoc;
	CurrentImage = imread(imageLoc, 1);

	//Display image in seperate thread
	thread t_display(&Projector::DisplayCurrentSlice, this);
	t_display.detach();

	if (!CurrentImage.data)
	{
		cout << "No Image data!" << endl;
		myFile << "No Image data!" << endl;

	}
	else
	{
		cout << "New Image loaded" << endl;
		myFile << "New Image loaded" << endl;
	}


}